

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O3

void __thiscall iDynTree::SensorsList::destructor(SensorsList *this)

{
  Sensor *pSVar1;
  pointer ppSVar2;
  pointer pvVar3;
  SensorsListPimpl *pSVar4;
  ulong uVar5;
  long lVar6;
  
  pSVar4 = this->pimpl;
  pvVar3 = (pSVar4->allSensors).
           super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = 0;
  do {
    ppSVar2 = *(pointer *)
               &pvVar3[lVar6].
                super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>._M_impl;
    if (pvVar3[lVar6].super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppSVar2) {
      uVar5 = 0;
      do {
        pSVar1 = ppSVar2[uVar5];
        if (pSVar1 != (Sensor *)0x0) {
          (*pSVar1->_vptr_Sensor[1])(pSVar1);
          pSVar4 = this->pimpl;
          pvVar3 = (pSVar4->allSensors).
                   super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        uVar5 = uVar5 + 1;
        ppSVar2 = *(pointer *)
                   &pvVar3[lVar6].
                    super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
                    _M_impl;
      } while (uVar5 < (ulong)((long)pvVar3[lVar6].
                                     super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3
                              ));
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  std::
  vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  ::resize(&pSVar4->allSensors,0);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
  ::resize(&this->pimpl->sensorsNameToIndex,0);
  pSVar4 = this->pimpl;
  if (pSVar4 != (SensorsListPimpl *)0x0) {
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
    ::~vector(&pSVar4->sensorsNameToIndex);
    std::
    vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
    ::~vector(&pSVar4->allSensors);
  }
  operator_delete(pSVar4,0x30);
  this->pimpl = (SensorsListPimpl *)0x0;
  return;
}

Assistant:

void SensorsList::destructor()
{
    for( int sensor_type = 0; sensor_type < NR_OF_SENSOR_TYPES; sensor_type++ )
    {
        for(size_t sensor_index = 0;
            sensor_index < this->pimpl->allSensors[sensor_type].size(); sensor_index++ )
        {
            delete this->pimpl->allSensors[sensor_type][sensor_index];
        }
    }
    this->pimpl->allSensors.resize(0);
    this->pimpl->sensorsNameToIndex.resize(0);

    delete this->pimpl;
    this->pimpl = 0;
}